

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O3

void resampler_write_sample(void *_r,short s)

{
  int iVar1;
  uint uVar2;
  
  if (*(char *)((long)_r + 0x31) < '\0') {
    *(undefined1 *)((long)_r + 0x31) = 0;
    uVar2 = 0xf;
    if (*(char *)((long)_r + 0x30) != '\x05') {
      uVar2 = (uint)(*(char *)((long)_r + 0x30) == '\x04');
    }
  }
  else {
    uVar2 = *(uint *)((long)_r + 4);
    if (0x3f < (int)*(uint *)((long)_r + 4)) {
      return;
    }
  }
  iVar1 = *_r;
  *(float *)((long)_r + (long)iVar1 * 4 + 0x48) = (float)(int)s * 256.0;
  *(float *)((long)_r + (long)iVar1 * 4 + 0x148) = (float)(int)s * 256.0;
  *(uint *)((long)_r + 4) = uVar2 + 1;
  uVar2 = iVar1 + 0x40;
  if (-1 < (int)(iVar1 + 1U)) {
    uVar2 = iVar1 + 1U;
  }
  *(uint *)_r = (iVar1 - (uVar2 & 0xffffffc0)) + 1;
  return;
}

Assistant:

void resampler_write_sample(void *_r, short s)
{
    resampler * r = ( resampler * ) _r;

    if ( r->delay_added < 0 )
    {
        r->delay_added = 0;
        r->write_filled = resampler_input_delay( r );
    }
    
    if ( r->write_filled < resampler_buffer_size )
    {
        float s32 = s;
        s32 *= 256.0;

        r->buffer_in[ r->write_pos ] = s32;
        r->buffer_in[ r->write_pos + resampler_buffer_size ] = s32;

        ++r->write_filled;

        r->write_pos = ( r->write_pos + 1 ) % resampler_buffer_size;
    }
}